

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void add_prefix_char(PCRE2_UCHAR16 chr,fast_forward_char_data *chars,BOOL last)

{
  byte bVar1;
  uint uVar2;
  uint local_20;
  sljit_u32 count;
  sljit_u32 i;
  BOOL last_local;
  fast_forward_char_data *chars_local;
  PCRE2_UCHAR16 chr_local;
  
  bVar1 = chars->count;
  uVar2 = (uint)bVar1;
  if (uVar2 != 0xff) {
    if (uVar2 == 0) {
      chars->count = '\x01';
      chars->chars[0] = chr;
      if (last != 0) {
        chars->last_count = '\x01';
      }
    }
    else {
      for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
        if (chars->chars[local_20] == chr) {
          return;
        }
      }
      if (uVar2 < 5) {
        chars->chars[uVar2] = chr;
        chars->count = bVar1 + 1;
        if (last != 0) {
          chars->last_count = chars->last_count + '\x01';
        }
      }
      else {
        chars->count = 0xff;
      }
    }
  }
  return;
}

Assistant:

static SLJIT_INLINE void add_prefix_char(PCRE2_UCHAR chr, fast_forward_char_data *chars, BOOL last)
{
sljit_u32 i, count = chars->count;

if (count == 255)
  return;

if (count == 0)
  {
  chars->count = 1;
  chars->chars[0] = chr;

  if (last)
    chars->last_count = 1;
  return;
  }

for (i = 0; i < count; i++)
  if (chars->chars[i] == chr)
    return;

if (count >= MAX_DIFF_CHARS)
  {
  chars->count = 255;
  return;
  }

chars->chars[count] = chr;
chars->count = count + 1;

if (last)
  chars->last_count++;
}